

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_slow(deflate_state *s,int flush)

{
  uInt uVar1;
  uInt uVar2;
  uInt uVar3;
  byte bVar4;
  ushf uVar5;
  ushort uVar6;
  uInt uVar7;
  uint uVar8;
  uInt uVar9;
  int in_ESI;
  deflate_state *in_RDI;
  uch cc_1;
  uch cc;
  ush dist;
  uch len;
  uInt max_insert;
  int bflush;
  IPos hash_head;
  z_streamp in_stack_ffffffffffffffa0;
  deflate_state *strm;
  Bytef *in_stack_ffffffffffffffb8;
  deflate_state *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  deflate_state *in_stack_ffffffffffffffd0;
  uint local_18;
  
  local_18 = 0;
  do {
    if (in_RDI->lookahead < 0x106) {
      fill_window(in_stack_ffffffffffffffc0);
      if ((in_RDI->lookahead < 0x106) && (in_ESI == 0)) {
        return need_more;
      }
      if (in_RDI->lookahead == 0) {
        if (in_RDI->match_available != 0) {
          bVar4 = in_RDI->window[in_RDI->strstart - 1];
          in_RDI->d_buf[in_RDI->last_lit] = 0;
          uVar8 = in_RDI->last_lit;
          in_RDI->last_lit = uVar8 + 1;
          in_RDI->l_buf[uVar8] = bVar4;
          in_RDI->dyn_ltree[bVar4].fc.freq = in_RDI->dyn_ltree[bVar4].fc.freq + 1;
          in_RDI->match_available = 0;
        }
        strm = in_RDI;
        _tr_flush_block(in_stack_ffffffffffffffd0,
                        (charf *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        (ulg)in_stack_ffffffffffffffc0,
                        (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        in_RDI->block_start = (ulong)in_RDI->strstart;
        flush_pending((z_streamp)strm);
        if (in_RDI->strm->avail_out == 0) {
          if (in_ESI != 4) {
            return need_more;
          }
          return finish_started;
        }
        if (in_ESI != 4) {
          return block_done;
        }
        return finish_done;
      }
    }
    if (2 < in_RDI->lookahead) {
      in_RDI->ins_h =
           (in_RDI->ins_h << ((byte)in_RDI->hash_shift & 0x1f) ^
           (uint)in_RDI->window[in_RDI->strstart + 2]) & in_RDI->hash_mask;
      uVar6 = in_RDI->head[in_RDI->ins_h];
      in_RDI->prev[in_RDI->strstart & in_RDI->w_mask] = uVar6;
      local_18 = (uint)uVar6;
      in_RDI->head[in_RDI->ins_h] = (Posf)in_RDI->strstart;
    }
    in_RDI->prev_length = in_RDI->match_length;
    in_RDI->prev_match = in_RDI->match_start;
    in_RDI->match_length = 2;
    if (((local_18 != 0) && (in_RDI->prev_length < in_RDI->max_lazy_match)) &&
       (in_RDI->strstart - local_18 <= in_RDI->w_size - 0x106)) {
      if ((in_RDI->strategy == 2) || (in_RDI->strategy == 3)) {
        if ((in_RDI->strategy == 3) && (in_RDI->strstart - local_18 == 1)) {
          uVar7 = longest_match_fast(in_RDI,local_18);
          in_RDI->match_length = uVar7;
        }
      }
      else {
        uVar7 = longest_match(in_RDI,local_18);
        in_RDI->match_length = uVar7;
      }
      if ((in_RDI->match_length < 6) &&
         ((in_RDI->strategy == 1 ||
          ((in_RDI->match_length == 3 && (0x1000 < in_RDI->strstart - in_RDI->match_start)))))) {
        in_RDI->match_length = 2;
      }
    }
    if ((in_RDI->prev_length < 3) || (in_RDI->prev_length < in_RDI->match_length)) {
      if (in_RDI->match_available == 0) {
        in_RDI->match_available = 1;
        in_RDI->strstart = in_RDI->strstart + 1;
        in_RDI->lookahead = in_RDI->lookahead - 1;
      }
      else {
        bVar4 = in_RDI->window[in_RDI->strstart - 1];
        in_RDI->d_buf[in_RDI->last_lit] = 0;
        uVar8 = in_RDI->last_lit;
        in_RDI->last_lit = uVar8 + 1;
        in_RDI->l_buf[uVar8] = bVar4;
        in_RDI->dyn_ltree[bVar4].fc.freq = in_RDI->dyn_ltree[bVar4].fc.freq + 1;
        if (in_RDI->last_lit == in_RDI->lit_bufsize - 1) {
          _tr_flush_block(in_stack_ffffffffffffffd0,
                          (charf *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (ulg)in_stack_ffffffffffffffc0,
                          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
          in_RDI->block_start = (ulong)in_RDI->strstart;
          flush_pending(in_stack_ffffffffffffffa0);
        }
        in_RDI->strstart = in_RDI->strstart + 1;
        in_RDI->lookahead = in_RDI->lookahead - 1;
        if (in_RDI->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
    else {
      uVar7 = in_RDI->strstart;
      uVar1 = in_RDI->lookahead;
      bVar4 = (char)in_RDI->prev_length - 3;
      uVar5 = ((short)in_RDI->strstart + -1) - (short)in_RDI->prev_match;
      in_RDI->d_buf[in_RDI->last_lit] = uVar5;
      uVar8 = in_RDI->last_lit;
      in_RDI->last_lit = uVar8 + 1;
      in_RDI->l_buf[uVar8] = bVar4;
      uVar6 = uVar5 - 1;
      in_RDI->dyn_ltree[(int)(""[bVar4] + 0x101)].fc.freq =
           in_RDI->dyn_ltree[(int)(""[bVar4] + 0x101)].fc.freq + 1;
      in_stack_ffffffffffffffd0 = (deflate_state *)in_RDI->dyn_dtree;
      if (uVar6 < 0x100) {
        bVar4 = ""[uVar6];
      }
      else {
        bVar4 = ""[((int)(uint)uVar6 >> 7) + 0x100];
      }
      in_stack_ffffffffffffffcc = (uint)bVar4;
      (((ct_data_s *)((long)in_stack_ffffffffffffffd0 + (long)(int)in_stack_ffffffffffffffcc * 4))->
      fc).freq = (((ct_data_s *)
                  ((long)in_stack_ffffffffffffffd0 + (long)(int)in_stack_ffffffffffffffcc * 4))->fc)
                 .freq + 1;
      uVar2 = in_RDI->last_lit;
      uVar3 = in_RDI->lit_bufsize;
      in_RDI->lookahead = in_RDI->lookahead - (in_RDI->prev_length - 1);
      in_RDI->prev_length = in_RDI->prev_length - 2;
      do {
        uVar8 = in_RDI->strstart + 1;
        in_RDI->strstart = uVar8;
        if (uVar8 <= (uVar7 + uVar1) - 3) {
          in_RDI->ins_h =
               (in_RDI->ins_h << ((byte)in_RDI->hash_shift & 0x1f) ^
               (uint)in_RDI->window[in_RDI->strstart + 2]) & in_RDI->hash_mask;
          uVar6 = in_RDI->head[in_RDI->ins_h];
          in_RDI->prev[in_RDI->strstart & in_RDI->w_mask] = uVar6;
          local_18 = (uint)uVar6;
          in_RDI->head[in_RDI->ins_h] = (Posf)in_RDI->strstart;
        }
        uVar9 = in_RDI->prev_length - 1;
        in_RDI->prev_length = uVar9;
      } while (uVar9 != 0);
      in_RDI->match_available = 0;
      in_RDI->match_length = 2;
      in_RDI->strstart = in_RDI->strstart + 1;
      if (uVar2 == uVar3 - 1) {
        if (in_RDI->block_start < 0) {
          in_stack_ffffffffffffffb8 = (Bytef *)0x0;
        }
        else {
          in_stack_ffffffffffffffb8 = in_RDI->window + (in_RDI->block_start & 0xffffffff);
        }
        in_stack_ffffffffffffffc0 = in_RDI;
        _tr_flush_block(in_stack_ffffffffffffffd0,
                        (charf *)(ulong)CONCAT14(bVar4,in_stack_ffffffffffffffc8),(ulg)in_RDI,
                        (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        in_RDI->block_start = (ulong)in_RDI->strstart;
        flush_pending(in_stack_ffffffffffffffa0);
        if (in_RDI->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_slow(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head = NIL;    /* head of hash chain */
    int bflush;              /* set if current block must be flushed */

    /* Process the input block. */
    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         */
        s->prev_length = s->match_length, s->prev_match = s->match_start;
        s->match_length = MIN_MATCH-1;

        if (hash_head != NIL && s->prev_length < s->max_lazy_match &&
            s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            if (s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) {
                s->match_length = longest_match (s, hash_head);
            } else if (s->strategy == Z_RLE && s->strstart - hash_head == 1) {
                s->match_length = longest_match_fast (s, hash_head);
            }
            /* longest_match() or longest_match_fast() sets match_start */

            if (s->match_length <= 5 && (s->strategy == Z_FILTERED
#if TOO_FAR <= 32767
                || (s->match_length == MIN_MATCH &&
                    s->strstart - s->match_start > TOO_FAR)
#endif
                )) {

                /* If prev_match is also MIN_MATCH, match_start is garbage
                 * but we will ignore the current match anyway.
                 */
                s->match_length = MIN_MATCH-1;
            }
        }
        /* If there was a match at the previous step and the current
         * match is not better, output the previous match:
         */
        if (s->prev_length >= MIN_MATCH && s->match_length <= s->prev_length) {
            uInt max_insert = s->strstart + s->lookahead - MIN_MATCH;
            /* Do not insert strings in hash table beyond this. */

            check_match(s, s->strstart-1, s->prev_match, s->prev_length);

            _tr_tally_dist(s, s->strstart -1 - s->prev_match,
                           s->prev_length - MIN_MATCH, bflush);

            /* Insert in hash table all strings up to the end of the match.
             * strstart-1 and strstart are already inserted. If there is not
             * enough lookahead, the last two strings are not inserted in
             * the hash table.
             */
            s->lookahead -= s->prev_length-1;
            s->prev_length -= 2;
            do {
                if (++s->strstart <= max_insert) {
                    INSERT_STRING(s, s->strstart, hash_head);
                }
            } while (--s->prev_length != 0);
            s->match_available = 0;
            s->match_length = MIN_MATCH-1;
            s->strstart++;

            if (bflush) FLUSH_BLOCK(s, 0);

        } else if (s->match_available) {
            /* If there was no match at the previous position, output a
             * single literal. If there was a match but the current match
             * is longer, truncate the previous match to a single literal.
             */
            Tracevv((stderr,"%c", s->window[s->strstart-1]));
            _tr_tally_lit(s, s->window[s->strstart-1], bflush);
            if (bflush) {
                FLUSH_BLOCK_ONLY(s, 0);
            }
            s->strstart++;
            s->lookahead--;
            if (s->strm->avail_out == 0) return need_more;
        } else {
            /* There is no previous match to compare with, wait for
             * the next step to decide.
             */
            s->match_available = 1;
            s->strstart++;
            s->lookahead--;
        }
    }
    Assert (flush != Z_NO_FLUSH, "no flush?");
    if (s->match_available) {
        Tracevv((stderr,"%c", s->window[s->strstart-1]));
        _tr_tally_lit(s, s->window[s->strstart-1], bflush);
        s->match_available = 0;
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}